

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O1

CommandOptions * read_PCM_file(CommandOptions *Options,IFileReaderFactory *fileReaderFactory)

{
  uint uVar1;
  double dVar2;
  bool bVar3;
  MDD_t MVar4;
  long *plVar5;
  undefined8 uVar6;
  AudioDescriptor *pAVar7;
  AESDecContext *this;
  HMACContext *this_00;
  long lVar8;
  IFileReaderFactory *in_RDX;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  MXFReader Reader;
  FrameBuffer FrameBuffer;
  WriterInfo Info;
  Result_t result;
  InterchangeObject *tmp_obj;
  WavFileWriter OutWave;
  undefined1 local_328 [24];
  CommandOptions *local_310;
  undefined1 local_308 [40];
  undefined1 local_2e0 [65];
  bool local_29f;
  _Alloc_hider local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  _Alloc_hider local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  int local_230 [26];
  _func_int **local_1c8;
  undefined8 uStack_1c0;
  uint local_1a0;
  WavFileWriter local_158;
  undefined1 local_100 [208];
  
  AS_02::PCM::MXFReader::MXFReader((MXFReader *)local_328,in_RDX);
  ASDCP::FrameBuffer::FrameBuffer((FrameBuffer *)local_308);
  local_308._0_8_ = &PTR__FrameBuffer_00112c60;
  local_158.m_OutFile.super__List_base<WavFileElement_*,_std::allocator<WavFileElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&local_158.m_OutFile;
  local_158.m_ADesc.EditRate.Numerator = 0;
  local_158.m_ADesc.EditRate.Denominator = 0;
  local_158.m_ADesc.AudioSamplingRate.Numerator = 0;
  local_158.m_ADesc.AudioSamplingRate.Denominator = 0;
  local_158.m_OutFile.super__List_base<WavFileElement_*,_std::allocator<WavFileElement_*>_>._M_impl.
  _M_node._M_size = 0;
  local_158.m_ChannelCount = 0;
  if (*(int *)((long)&fileReaderFactory[5]._vptr_IFileReaderFactory + 4) == 0 &&
      *(int *)&fileReaderFactory[5]._vptr_IFileReaderFactory == 0) {
    fileReaderFactory[5]._vptr_IFileReaderFactory = ASDCP::EditRate_24;
  }
  local_158.m_OutFile.super__List_base<WavFileElement_*,_std::allocator<WavFileElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       local_158.m_OutFile.super__List_base<WavFileElement_*,_std::allocator<WavFileElement_*>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2e0,(char *)fileReaderFactory[0xb]._vptr_IFileReaderFactory,
             (allocator<char> *)&local_1c8);
  local_328._16_8_ = local_230;
  AS_02::PCM::MXFReader::OpenRead((string *)local_328._16_8_,(Rational *)local_328);
  if (local_2e0._0_8_ != (long)local_2e0 + 0x10) {
    operator_delete((void *)local_2e0._0_8_,(ulong)(local_2e0._16_8_ + 1));
  }
  if (local_230[0] < 0) {
    uVar9 = 0;
    pAVar7 = (AudioDescriptor *)0x0;
  }
  else {
    if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
      read_PCM_file();
    }
    local_1c8 = (_func_int **)0x0;
    plVar5 = (long *)AS_02::PCM::MXFReader::OP1aHeader();
    MVar4 = ASDCP::DefaultCompositeDict();
    uVar6 = ASDCP::Dictionary::Type(MVar4);
    (**(code **)(*plVar5 + 0xa8))(local_2e0,plVar5,uVar6,&local_1c8);
    Kumu::Result_t::operator=((Result_t *)local_230,(Result_t *)local_2e0);
    Kumu::Result_t::~Result_t((Result_t *)local_2e0);
    bVar3 = true;
    if (local_230[0] < 0) {
      uVar9 = 0;
      pAVar7 = (AudioDescriptor *)0x0;
    }
    else {
      if (local_1c8 == (_func_int **)0x0) {
        pAVar7 = (AudioDescriptor *)0x0;
      }
      else {
        pAVar7 = (AudioDescriptor *)
                 __dynamic_cast(local_1c8,&ASDCP::MXF::InterchangeObject::typeinfo,
                                &ASDCP::MXF::WaveAudioDescriptor::typeinfo,0);
      }
      if (pAVar7 == (AudioDescriptor *)0x0) {
        fwrite("File does not contain an essence descriptor.\n",0x2d,1,_stderr);
        Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)&Kumu::RESULT_FAIL);
        uVar9 = 0;
        pAVar7 = (AudioDescriptor *)0x0;
        bVar3 = false;
      }
      else {
        if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
          (**(code **)((long)pAVar7->EditRate + 0x88))(pAVar7,0);
        }
        if (pAVar7[5].AudioSamplingRate == (Rational)0x0) {
          fwrite("ContainerDuration not set in file descriptor, attempting to use index duration.\n"
                 ,0x50,1,_stderr);
          AS_02::PCM::MXFReader::AS02IndexReader();
          uVar9 = AS_02::MXF::AS02IndexReader::GetDuration();
        }
        else {
          uVar9 = 0;
          if ((char)pAVar7[5].Locked != '\0') {
            uVar9 = pAVar7[5].AudioSamplingRate.Numerator;
          }
        }
        if (uVar9 == 0) {
          fwrite("ContainerDuration not set in index, attempting to use Duration from SourceClip.\n"
                 ,0x50,1,_stderr);
          plVar5 = (long *)AS_02::PCM::MXFReader::OP1aHeader();
          MVar4 = ASDCP::DefaultCompositeDict();
          uVar6 = ASDCP::Dictionary::Type(MVar4);
          (**(code **)(*plVar5 + 0xa8))(local_2e0,plVar5,uVar6,&local_1c8);
          Kumu::Result_t::operator=((Result_t *)local_230,(Result_t *)local_2e0);
          Kumu::Result_t::~Result_t((Result_t *)local_2e0);
          if (local_230[0] < 0) {
            uVar9 = 0;
          }
          else {
            uVar9 = 0;
            lVar8 = __dynamic_cast(local_1c8,&ASDCP::MXF::InterchangeObject::typeinfo,
                                   &ASDCP::MXF::SourceClip::typeinfo,0);
            if (*(char *)(lVar8 + 200) != '\0') {
              uVar9 = *(uint *)(lVar8 + 0xc0);
            }
          }
        }
        if (uVar9 == 0) {
          fwrite("Unable to determine file duration.\n",0x23,1,_stderr);
          uVar9 = 0;
          Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)&Kumu::RESULT_FAIL);
          bVar3 = false;
        }
        else {
          ceil(((double)pAVar7[7].AudioSamplingRate.Numerator /
               (double)pAVar7[7].AudioSamplingRate.Denominator) /
               ((double)*(int *)&fileReaderFactory[5]._vptr_IFileReaderFactory /
               (double)*(int *)((long)&fileReaderFactory[5]._vptr_IFileReaderFactory + 4)));
          ASDCP::FrameBuffer::Capacity((int)local_100 + 0x68);
          Kumu::Result_t::~Result_t((Result_t *)(local_100 + 0x68));
          dVar2 = ceil(((double)pAVar7[7].AudioSamplingRate.Numerator /
                       (double)pAVar7[7].AudioSamplingRate.Denominator) /
                       ((double)*(int *)&fileReaderFactory[5]._vptr_IFileReaderFactory /
                       (double)*(int *)((long)&fileReaderFactory[5]._vptr_IFileReaderFactory + 4)));
          uVar9 = ((int)((ulong)uVar9 / ((long)dVar2 & 0xffffffffU)) + 1) -
                  (uint)((int)((ulong)uVar9 % ((long)dVar2 & 0xffffffffU)) == 0);
        }
      }
    }
    if (!bVar3) goto LAB_0010a8f4;
  }
  if (local_230[0] < 0) {
LAB_0010a654:
    if ((-1 < local_230[0]) &&
       (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 1) == '\x01')) {
      this = (AESDecContext *)operator_new(8);
      ASDCP::AESDecContext::AESDecContext(this);
      ASDCP::AESDecContext::InitKey(local_2e0);
      Kumu::Result_t::operator=((Result_t *)local_230,(Result_t *)local_2e0);
      Kumu::Result_t::~Result_t((Result_t *)local_2e0);
      if ((-1 < local_230[0]) &&
         (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 2) == '\x01')) {
        ASDCP::WriterInfo::WriterInfo((WriterInfo *)local_2e0);
        AS_02::PCM::MXFReader::FillWriterInfo((WriterInfo *)local_100);
        Kumu::Result_t::~Result_t((Result_t *)local_100);
        if (local_29f == true) {
          this_00 = (HMACContext *)operator_new(8);
          ASDCP::HMACContext::HMACContext(this_00);
          ASDCP::HMACContext::InitKey((uchar *)&local_1c8,(LabelSet_t)this_00);
          Kumu::Result_t::operator=((Result_t *)local_230,(Result_t *)&local_1c8);
          Kumu::Result_t::~Result_t((Result_t *)&local_1c8);
        }
        else {
          read_PCM_file();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_p != &local_248) {
          operator_delete(local_258._M_p,local_248._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_p != &local_268) {
          operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_p != &local_288) {
          operator_delete(local_298._M_p,local_288._M_allocated_capacity + 1);
        }
      }
    }
    if ((-1 < local_230[0]) &&
       (uVar11 = *(uint *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4), uVar11 < uVar9
       )) {
      local_328._16_8_ = local_230;
      local_310 = Options;
      do {
        AS_02::PCM::MXFReader::ReadFrame
                  ((uint)(WavFileWriter *)local_2e0,(FrameBuffer *)local_328,
                   (AESDecContext *)(ulong)uVar11,(HMACContext *)local_308);
        Kumu::Result_t::operator=((Result_t *)local_230,(Result_t *)local_2e0);
        Kumu::Result_t::~Result_t((Result_t *)local_2e0);
        if (-1 < local_230[0]) {
          if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
            local_308._28_4_ = uVar11;
            ASDCP::PCM::FrameBuffer::Dump((_IO_FILE *)local_308,(uint)_stderr);
          }
          if (local_308._24_4_ != local_308._16_4_) {
            read_PCM_file();
          }
          WavFileWriter::WriteFrame((WavFileWriter *)local_2e0,(FrameBuffer *)&local_158);
          Kumu::Result_t::operator=((Result_t *)local_230,(Result_t *)local_2e0);
          Kumu::Result_t::~Result_t((Result_t *)local_2e0);
        }
        Options = local_310;
      } while ((-1 < local_230[0]) && (uVar11 = uVar11 + 1, uVar11 < uVar9));
    }
  }
  else {
    uVar11 = *(uint *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4);
    uVar1 = *(uint *)&fileReaderFactory[3]._vptr_IFileReaderFactory;
    uVar10 = uVar9;
    if (uVar1 < uVar9) {
      uVar10 = uVar1;
    }
    if (uVar1 == 0) {
      uVar10 = uVar9;
    }
    if (uVar11 == 0) {
LAB_0010a5b2:
      local_1c8 = (_func_int **)0x0;
      uStack_1c0 = 0;
      ASDCP::MD_to_PCM_ADesc((WaveAudioDescriptor *)local_2e0,pAVar7);
      Kumu::Result_t::operator=((Result_t *)local_230,(Result_t *)local_2e0);
      uVar9 = uVar10 - uVar11;
      Kumu::Result_t::~Result_t((Result_t *)local_2e0);
      if (-1 < local_230[0]) {
        local_1c8 = fileReaderFactory[5]._vptr_IFileReaderFactory;
        local_1a0 = uVar9;
        WavFileWriter::OpenWrite
                  ((WavFileWriter *)local_2e0,&local_158.m_ADesc,(char *)&local_1c8,
                   (SplitType_t)fileReaderFactory[6]._vptr_IFileReaderFactory);
        Kumu::Result_t::operator=((Result_t *)local_230,(Result_t *)local_2e0);
        Kumu::Result_t::~Result_t((Result_t *)local_2e0);
      }
      goto LAB_0010a654;
    }
    if (uVar11 <= uVar10) {
      if (uVar11 + uVar10 < uVar10) {
        uVar10 = uVar11 + uVar10;
      }
      goto LAB_0010a5b2;
    }
    read_PCM_file();
    local_328._16_8_ = &Kumu::RESULT_FAIL;
  }
  Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)local_328._16_8_);
LAB_0010a8f4:
  Kumu::Result_t::~Result_t((Result_t *)local_230);
  WavFileWriter::~WavFileWriter(&local_158);
  ASDCP::FrameBuffer::~FrameBuffer((FrameBuffer *)local_308);
  AS_02::PCM::MXFReader::~MXFReader((MXFReader *)local_328);
  return Options;
}

Assistant:

Result_t
read_PCM_file(CommandOptions& Options, const Kumu::IFileReaderFactory& fileReaderFactory)
{
  AESDecContext*     Context = 0;
  HMACContext*       HMAC = 0;
  AS_02::PCM::MXFReader     Reader(fileReaderFactory);
  PCM::FrameBuffer   FrameBuffer;
  WavFileWriter      OutWave;
  ui32_t last_frame = 0;
  ASDCP::MXF::WaveAudioDescriptor *wave_descriptor = 0;

  if ( Options.edit_rate == ASDCP::Rational(0,0) ) // todo, make this available to the CLI
    {
      Options.edit_rate = EditRate_24;
    }

  Result_t result = Reader.OpenRead(Options.input_filename, Options.edit_rate);

  if ( KM_SUCCESS(result) )
    {
      if ( Options.verbose_flag )
	{
	  fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
	}
      
      ASDCP::MXF::InterchangeObject* tmp_obj = 0;

      result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_WaveAudioDescriptor), &tmp_obj);

      if ( KM_SUCCESS(result) )
	{
	  wave_descriptor = dynamic_cast<ASDCP::MXF::WaveAudioDescriptor*>(tmp_obj);

	  if ( wave_descriptor == 0 )
	    {
	      fprintf(stderr, "File does not contain an essence descriptor.\n");
	      return RESULT_FAIL;
	    }
      
	  if ( Options.verbose_flag )
	    {
	      wave_descriptor->Dump();
	    }

	  if ( wave_descriptor->ContainerDuration.get() == 0 )
	    {
	      fprintf(stderr, "ContainerDuration not set in file descriptor, attempting to use index duration.\n");
	      last_frame = Reader.AS02IndexReader().GetDuration();
	    }
	  else
	    {
              if ( ! wave_descriptor->ContainerDuration.empty() )
                {
	          last_frame = (ui32_t)wave_descriptor->ContainerDuration;
                }
	    }

	  if ( last_frame == 0 )
	    {
	      fprintf(stderr, "ContainerDuration not set in index, attempting to use Duration from SourceClip.\n");
	      result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_SourceClip), &tmp_obj);
	      if ( KM_SUCCESS(result))
		{
	    	  ASDCP::MXF::SourceClip *sourceClip = dynamic_cast<ASDCP::MXF::SourceClip*>(tmp_obj);
	    	  if ( ! sourceClip->Duration.empty() )
		    {
		      last_frame = (ui32_t)sourceClip->Duration;
		    }
		}
	    }

	  if ( last_frame == 0 )
	    {
	      fprintf(stderr, "Unable to determine file duration.\n");
	      return RESULT_FAIL;
	    }

	  assert(wave_descriptor);
	  FrameBuffer.Capacity(AS_02::MXF::CalcFrameBufferSize(*wave_descriptor, Options.edit_rate));
	  last_frame = AS_02::MXF::CalcFramesFromDurationInSamples(last_frame, *wave_descriptor, Options.edit_rate);
	}
    }

  if ( ASDCP_SUCCESS(result) )
    {
      if ( Options.duration > 0 && Options.duration < last_frame )
	last_frame = Options.duration;

      if ( Options.start_frame > 0 )
	{
	  if ( Options.start_frame > last_frame )
	    {
	      fprintf(stderr, "Start value greater than file duration.\n");
	      return RESULT_FAIL;
	    }

	  last_frame = Kumu::xmin(Options.start_frame + last_frame, last_frame);
	}

      last_frame = last_frame - Options.start_frame;

      PCM::AudioDescriptor ADesc;

      result = MD_to_PCM_ADesc(wave_descriptor, ADesc);

      if ( ASDCP_SUCCESS(result) )
	{
	  ADesc.ContainerDuration = last_frame;
	  ADesc.EditRate = Options.edit_rate;

	  result = OutWave.OpenWrite(ADesc, Options.file_prefix,
				     ( Options.split_wav ? WavFileWriter::ST_STEREO : 
				       ( Options.mono_wav ? WavFileWriter::ST_MONO : WavFileWriter::ST_NONE ) ));
	}
    }

#ifdef HAVE_OPENSSL
  if ( ASDCP_SUCCESS(result) && Options.key_flag )
    {
      Context = new AESDecContext;
      result = Context->InitKey(Options.key_value);

      if ( ASDCP_SUCCESS(result) && Options.read_hmac )
	{
	  WriterInfo Info;
	  Reader.FillWriterInfo(Info);

	  if ( Info.UsesHMAC )
	    {
	      HMAC = new HMACContext;
	      result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
	    }
	  else
	    {
	      fputs("File does not contain HMAC values, ignoring -m option.\n", stderr);
	    }
	}
    }
#endif // HAVE_OPENSSL

  for ( ui32_t i = Options.start_frame; ASDCP_SUCCESS(result) && i < last_frame; i++ )
    {
      result = Reader.ReadFrame(i, FrameBuffer, Context, HMAC);

      if ( ASDCP_SUCCESS(result) )
	{
	  if ( Options.verbose_flag )
	    {
	      FrameBuffer.FrameNumber(i);
	      FrameBuffer.Dump(stderr, Options.fb_dump_size);
	    }

	  if ( FrameBuffer.Size() != FrameBuffer.Capacity() )
	    {
	      fprintf(stderr, "Last frame is incomplete, padding with zeros.\n");
	      // actually, it has already been zeroed for us, we just need to recognize the appropriate size
	      FrameBuffer.Size(FrameBuffer.Capacity());
	    }

	  result = OutWave.WriteFrame(FrameBuffer);
	}
    }

  return result;
}